

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O1

bool bc7decomp::unpack_bc7_mode1_3_7(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint32_t bits;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 *puVar4;
  uint8_t uVar5;
  undefined1 *puVar6;
  uint32_t total_bits_1;
  ulong uVar7;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar12;
  uint uVar13;
  uint32_t total_bits_2;
  uint uVar14;
  uint32_t total_bits;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint32_t bits_2;
  int iVar20;
  uint uVar21;
  long lVar22;
  uint32_t bits_1;
  uint uVar23;
  bool bVar24;
  uint32_t weights [16];
  undefined1 local_d8 [4];
  undefined1 local_d4 [12];
  uint auStack_c8 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_b8 [16];
  uint auStack_78 [10];
  color_rgba endpoints [4];
  uint32_t pbits [4];
  
  bVar24 = mode == 1;
  uVar13 = 5;
  if (mode != 7) {
    uVar13 = bVar24 ^ 7;
  }
  uVar14 = 0;
  uVar1 = 0;
  uVar10 = mode + 1;
  if (uVar10 != 0) {
    uVar1 = 0;
    uVar15 = 0;
    uVar14 = 0;
    do {
      iVar17 = 8 - (uVar14 & 7);
      if ((int)(uVar10 - uVar15) <= iVar17) {
        iVar17 = uVar10 - uVar15;
      }
      uVar1 = uVar1 | (~(-1 << ((byte)iVar17 & 0x1f)) &
                      (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar14 >> 3)) >>
                            (sbyte)(uVar14 & 7))) << ((byte)uVar15 & 0x1f);
      uVar15 = uVar15 + iVar17;
      uVar14 = uVar14 + iVar17;
    } while (uVar15 < uVar10);
  }
  uVar10 = 1 << ((byte)mode & 0x1f);
  if (uVar1 == uVar10) {
    uVar15 = bVar24 | 2;
    uVar7 = 0;
    uVar16 = 0;
    do {
      iVar17 = 8 - (uVar14 & 7);
      if ((int)(6 - uVar16) <= iVar17) {
        iVar17 = 6 - uVar16;
      }
      uVar2 = (uint)uVar7 |
              (~(-1 << ((byte)iVar17 & 0x1f)) &
              (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar14 >> 3)) >> (sbyte)(uVar14 & 7))) <<
              ((byte)uVar16 & 0x1f);
      uVar7 = (ulong)uVar2;
      uVar16 = uVar16 + iVar17;
      uVar14 = iVar17 + uVar14;
    } while (uVar16 < 6);
    uVar19 = (ulong)((mode == 7) + 3);
    uVar3 = 0;
    do {
      lVar11 = 0;
      do {
        uVar23 = 0;
        uVar16 = 0;
        do {
          uVar21 = uVar14;
          uVar18 = uVar21 & 7;
          iVar20 = uVar13 - uVar16;
          iVar17 = 8 - uVar18;
          if (iVar20 <= (int)(8 - uVar18)) {
            iVar17 = iVar20;
          }
          uVar23 = uVar23 | (~(-1 << ((byte)iVar17 & 0x1f)) &
                            (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar21 >> 3)) >>
                                  (sbyte)uVar18)) << ((byte)uVar16 & 0x1f);
          uVar16 = uVar16 + iVar17;
          uVar14 = iVar17 + uVar21;
        } while (uVar16 < uVar13);
        local_d8[lVar11 * 4 + uVar3] = (char)uVar23;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar19);
    iVar17 = 8 - uVar18;
    if (iVar20 < (int)(8 - uVar18)) {
      iVar17 = iVar20;
    }
    lVar11 = 0;
    do {
      uVar14 = iVar17 + uVar21 + (int)lVar11;
      auStack_c8[lVar11] =
           (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar14 >> 3)) >> (uVar14 & 7) & 1) != 0);
      lVar11 = lVar11 + 1;
    } while ((ulong)!bVar24 * 2 + 2 != lVar11);
    iVar17 = 8 - uVar18;
    if (iVar20 < (int)(8 - uVar18)) {
      iVar17 = iVar20;
    }
    uVar14 = uVar21 + (int)lVar11 + iVar17;
    uVar3 = 0;
    do {
      if ((uVar3 == 0) ||
         (uVar16 = uVar15, uVar3 == (byte)g_bc7_table_anchor_index_second_subset[uVar7])) {
        uVar16 = uVar15 - 1;
      }
      uVar21 = 0;
      uVar23 = 0;
      do {
        iVar17 = 8 - (uVar14 & 7);
        if ((int)(uVar16 - uVar23) <= iVar17) {
          iVar17 = uVar16 - uVar23;
        }
        uVar21 = uVar21 | (~(-1 << ((byte)iVar17 & 0x1f)) &
                          (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar14 >> 3)) >>
                                (sbyte)(uVar14 & 7))) << ((byte)uVar23 & 0x1f);
        uVar23 = uVar23 + iVar17;
        uVar14 = iVar17 + uVar14;
      } while (uVar23 < uVar16);
      auStack_78[uVar3] = uVar21;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x10);
    puVar6 = local_d8;
    lVar11 = 0;
    do {
      uVar7 = 0;
      do {
        bVar9 = 0xff;
        if (uVar19 != uVar7) {
          uVar14 = ((uint)(byte)puVar6[uVar7] * 2 | auStack_c8[(uint)lVar11 >> (mode == 1)]) <<
                   ((byte)uVar13 ^ 7);
          bVar9 = (byte)(uVar14 >> (byte)uVar13 + 1) | (byte)uVar14;
        }
        puVar6[uVar7] = bVar9;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
      lVar11 = lVar11 + 1;
      puVar6 = puVar6 + 4;
    } while (lVar11 != 4);
    paVar12 = local_b8;
    puVar6 = local_d4;
    lVar11 = 0;
    do {
      lVar22 = 0;
      paVar8 = paVar12;
      do {
        puVar4 = &g_bc7_weights2;
        if (mode == 1) {
          puVar4 = &g_bc7_weights3;
        }
        iVar17 = puVar4[lVar22];
        uVar7 = 0;
        do {
          paVar8->m_comps[uVar7] =
               (uint8_t)((uint)(byte)puVar6[uVar7 - 4] * (0x40 - iVar17) +
                         (uint)(byte)puVar6[uVar7] * iVar17 + 0x20 >> 6);
          uVar7 = uVar7 + 1;
        } while (uVar19 != uVar7);
        uVar5 = 0xff;
        if (mode == 7) {
          uVar5 = local_b8[0].m_comps[lVar22 * 4 + lVar11 * 0x20 + 3];
        }
        local_b8[0].m_comps[lVar22 * 4 + lVar11 * 0x20 + 3] = uVar5;
        lVar22 = lVar22 + 1;
        paVar8 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar8->m_comps + 4);
      } while ((uint)lVar22 >> (sbyte)uVar15 == 0);
      puVar6 = puVar6 + 8;
      paVar12 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar12->m_comps + 0x20);
      bVar24 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar24);
    lVar11 = 0;
    do {
      pPixels[lVar11].field_0 =
           local_b8[(ulong)(byte)g_bc7_partition2[(ulong)(uVar2 << 4) + lVar11] * 8 +
                    (ulong)auStack_78[lVar11]];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
  }
  return uVar1 == uVar10;
}

Assistant:

bool unpack_bc7_mode1_3_7(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	//const uint32_t SUBSETS = 2;
	const uint32_t ENDPOINTS = 4;
	const uint32_t COMPS = (mode == 7) ? 4 : 3;
	const uint32_t WEIGHT_BITS = (mode == 1) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 7) ? 5 : ((mode == 1) ? 6 : 7);
	const uint32_t PBITS = (mode == 1) ? 2 : 4;
	const uint32_t SHARED_PBITS = (mode == 1) ? true : false;
	const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t part = read_bits32(pBuf, bit_offset, 6);

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);
		
	uint32_t pbits[4];
	for (uint32_t p = 0; p < PBITS; p++)
		pbits[p] = read_bits32(pBuf, bit_offset, 1);
						
	uint32_t weights[16];
	for (uint32_t i = 0; i < 16; i++)
		weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == g_bc7_table_anchor_index_second_subset[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);
		
	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)((c == ((mode == 7U) ? 4U : 3U)) ? 255 : bc7_dequant(endpoints[e][c], pbits[SHARED_PBITS ? (e >> 1) : e], ENDPOINT_BITS));
		
	color_rgba block_colors[2][8];
	for (uint32_t s = 0; s < 2; s++)
		for (uint32_t i = 0; i < WEIGHT_VALS; i++)
		{
			for (uint32_t c = 0; c < COMPS; c++)
				block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
			block_colors[s][i][3] = (COMPS == 3) ? 255 : block_colors[s][i][3];
		}

	for (uint32_t i = 0; i < 16; i++)
		pPixels[i] = block_colors[g_bc7_partition2[part * 16 + i]][weights[i]];

	return true;
}